

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_colorspace_set_endpoints
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_XYZ *XYZ_in,int preferred)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  png_XYZ XYZ;
  png_xy xy;
  png_XYZ local_a8;
  int local_7c;
  png_xy local_78;
  png_XYZ local_58;
  
  local_a8.blue_Z = XYZ_in->blue_Z;
  uVar4._0_4_ = XYZ_in->red_X;
  uVar4._4_4_ = XYZ_in->red_Y;
  local_a8.red_Z = XYZ_in->red_Z;
  local_a8.green_X = XYZ_in->green_X;
  uVar5._0_4_ = XYZ_in->green_Y;
  uVar5._4_4_ = XYZ_in->green_Z;
  uVar6._0_4_ = XYZ_in->blue_X;
  uVar6._4_4_ = XYZ_in->blue_Y;
  local_a8._0_8_ = uVar4;
  local_a8._16_8_ = uVar5;
  local_a8._24_8_ = uVar6;
  local_7c = preferred;
  if (uVar6._4_4_ <= (int)((png_fixed_point)uVar5 ^ 0x7fffffffU) &&
      (png_fixed_point)uVar5 <= (int)(uVar4._4_4_ ^ 0x7fffffffU)) {
    iVar7 = (png_fixed_point)uVar5 + uVar4._4_4_ + uVar6._4_4_;
    if (iVar7 != 100000) {
      if (iVar7 == 0) goto LAB_0010bea4;
      iVar8 = 0;
      dVar3 = (double)iVar7;
      iVar7 = 0;
      if ((png_fixed_point)uVar4 != 0) {
        dVar2 = floor(((double)(png_fixed_point)uVar4 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar7 = (int)dVar2;
      }
      local_a8.red_X = iVar7;
      if (uVar4._4_4_ != 0) {
        dVar2 = floor(((double)uVar4._4_4_ * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar8 = (int)dVar2;
      }
      local_a8.red_Y = iVar8;
      iVar8 = 0;
      iVar7 = 0;
      if (local_a8.red_Z != 0) {
        dVar2 = floor(((double)local_a8.red_Z * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar7 = (int)dVar2;
      }
      local_a8.red_Z = iVar7;
      if (local_a8.green_X != 0) {
        dVar2 = floor(((double)local_a8.green_X * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar8 = (int)dVar2;
      }
      local_a8.green_X = iVar8;
      iVar8 = 0;
      iVar7 = 0;
      if ((png_fixed_point)uVar5 != 0) {
        dVar2 = floor(((double)(png_fixed_point)uVar5 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar7 = (int)dVar2;
      }
      local_a8.green_Y = iVar7;
      if (local_a8.green_Z != 0) {
        dVar2 = floor(((double)local_a8.green_Z * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar8 = (int)dVar2;
      }
      local_a8.green_Z = iVar8;
      iVar8 = 0;
      iVar7 = 0;
      if (local_a8.blue_X != 0) {
        dVar2 = floor(((double)local_a8.blue_X * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar7 = (int)dVar2;
      }
      local_a8.blue_X = iVar7;
      if (uVar6._4_4_ != 0) {
        dVar2 = floor(((double)uVar6._4_4_ * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_0010bea4;
        iVar8 = (int)dVar2;
      }
      local_a8.blue_Y = iVar8;
      if (local_a8.blue_Z == 0) {
        local_a8.blue_Z = 0;
      }
      else {
        dVar3 = floor(((double)local_a8.blue_Z * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar3) || (dVar3 < -2147483648.0)) goto LAB_0010bea4;
        local_a8.blue_Z = (png_fixed_point)dVar3;
      }
    }
    iVar7 = png_xy_from_XYZ(&local_78,&local_a8);
    if (iVar7 == 0) {
      local_58.blue_Z = local_a8.blue_Z;
      local_58.green_Y = local_a8.green_Y;
      local_58.green_Z = local_a8.green_Z;
      local_58.blue_X = local_a8.blue_X;
      local_58.blue_Y = local_a8.blue_Y;
      local_58.red_X = local_a8.red_X;
      local_58.red_Y = local_a8.red_Y;
      local_58.red_Z = local_a8.red_Z;
      local_58.green_X = local_a8.green_X;
      iVar7 = png_colorspace_check_xy(&local_58,&local_78);
      if (iVar7 != 1) {
        if (iVar7 == 0) {
          iVar7 = png_colorspace_set_xy_and_XYZ(png_ptr,colorspace,&local_78,&local_a8,local_7c);
          return iVar7;
        }
        pbVar1 = (byte *)((long)&colorspace->flags + 1);
        *pbVar1 = *pbVar1 | 0x80;
        png_error(png_ptr,"internal error checking chromaticities");
      }
    }
  }
LAB_0010bea4:
  pbVar1 = (byte *)((long)&colorspace->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  png_benign_error(png_ptr,"invalid end points");
  return 0;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_endpoints(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_XYZ *XYZ_in, int preferred)
{
   png_XYZ XYZ = *XYZ_in;
   png_xy xy;

   switch (png_colorspace_check_XYZ(&xy, &XYZ))
   {
      case 0:
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, &xy, &XYZ,
             preferred);

      case 1:
         /* End points are invalid. */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid end points");
         break;

      default:
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}